

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O0

int Sfm_LibFindAreaMatch(Sfm_Lib_t *p,word *pTruth,int nFanins,int *piObj)

{
  int i;
  int *piVar1;
  Sfm_Fun_t *pSVar2;
  int iFunc;
  Sfm_Fun_t *pObj;
  int *piObj_local;
  int nFanins_local;
  word *pTruth_local;
  Sfm_Lib_t *p_local;
  
  piVar1 = Vec_MemHashLookup(p->vTtMem,pTruth);
  if (*piVar1 == -1) {
    p_local._4_4_ = -1;
  }
  else {
    i = Vec_IntEntry(&p->vLists,*piVar1);
    pSVar2 = Sfm_LibFun(p,i);
    if (piObj != (int *)0x0) {
      *piObj = (int)(((long)pSVar2 - (long)p->pObjs) / 0x1c);
    }
    p_local._4_4_ = pSVar2->Area;
  }
  return p_local._4_4_;
}

Assistant:

int Sfm_LibFindAreaMatch( Sfm_Lib_t * p, word * pTruth, int nFanins, int * piObj )
{
    Sfm_Fun_t * pObj = NULL;
    int iFunc = *Vec_MemHashLookup( p->vTtMem,  pTruth );
    if ( iFunc == -1 )
        return -1;
    Sfm_LibForEachSuper( p, pObj, iFunc )
        break;
    if ( piObj )
        *piObj = pObj - p->pObjs;
    return pObj->Area;
}